

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::PLYWriter::addProperty(PLYWriter *this,string *name,ply_type tvalue)

{
  PLYElement *this_00;
  IOException *pIVar1;
  allocator local_59;
  PLYProperty local_58;
  
  if (this->header_complete == true) {
    pIVar1 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_58,"Creation of ply header has been completed",&local_59);
    gutil::IOException::IOException(pIVar1,(string *)&local_58);
    __cxa_throw(pIVar1,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  this_00 = this->element;
  if (this_00 != (PLYElement *)0x0) {
    anon_unknown_3::PLYProperty::PLYProperty(&local_58,name,tvalue,this->enc);
    PLYElement::addProperty(this_00,&local_58);
    anon_unknown_3::PLYProperty::~PLYProperty(&local_58);
    return;
  }
  pIVar1 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_58,"PLYWriter: Adding a property without an element",&local_59);
  gutil::IOException::IOException(pIVar1,(string *)&local_58);
  __cxa_throw(pIVar1,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PLYWriter::addProperty(const std::string &name, ply_type tvalue)
{
  if (header_complete)
  {
    throw gutil::IOException("Creation of ply header has been completed");
  }

  if (element == 0)
  {
    throw gutil::IOException("PLYWriter: Adding a property without an element");
  }

  element->addProperty(PLYProperty(name, tvalue, enc));
}